

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O2

void Bmc_CexCarePropagateFwdOne(Gia_Man_t *p,Abc_Cex_t *pCex,int f,int fGrow)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  uint uVar9;
  uint Var;
  uint uVar10;
  int iVar11;
  
  if ((fGrow & 2U) == 0) {
    iVar11 = 0;
    while ((iVar11 < p->vCis->nSize - p->nRegs &&
           (pGVar7 = Gia_ManCi(p,iVar11), pGVar7 != (Gia_Obj_t *)0x0))) {
      iVar1 = pCex->nPis * f;
      uVar2 = iVar1 + pCex->nRegs + iVar11;
      uVar2 = Abc_Var2Lit(iVar11 + iVar1 + 1,
                          (uint)(((uint)(&pCex[1].iPo)[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0)
                         );
      pGVar7->Value = uVar2;
      iVar11 = iVar11 + 1;
    }
  }
  else {
    iVar1 = 0;
    iVar11 = 0;
    while ((iVar11 < p->vCis->nSize - p->nRegs &&
           (pGVar7 = Gia_ManCi(p,iVar11), pGVar7 != (Gia_Obj_t *)0x0))) {
      uVar2 = pCex->nPis * f + pCex->nRegs + iVar11;
      uVar2 = Abc_Var2Lit((f + 1) * pCex->nPis + iVar1,
                          (uint)(((uint)(&pCex[1].iPo)[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0)
                         );
      pGVar7->Value = uVar2;
      iVar11 = iVar11 + 1;
      iVar1 = iVar1 + -1;
    }
  }
  iVar11 = 0;
  do {
    if ((p->nObjs <= iVar11) || (pGVar7 = Gia_ManObj(p,iVar11), pGVar7 == (Gia_Obj_t *)0x0)) {
      iVar11 = 0;
      while ((iVar11 < p->vCos->nSize && (pGVar7 = Gia_ManCo(p,iVar11), pGVar7 != (Gia_Obj_t *)0x0))
            ) {
        if ((int)pGVar7[-(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)].Value < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf5,"int Abc_LitNotCond(int, int)");
        }
        pGVar7->Value =
             (uint)*(undefined8 *)pGVar7 >> 0x1d & 1 ^
             pGVar7[-(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)].Value;
        iVar11 = iVar11 + 1;
      }
      return;
    }
    uVar8 = *(ulong *)pGVar7 & 0x1fffffff;
    if (uVar8 != 0x1fffffff && -1 < (int)*(ulong *)pGVar7) {
      uVar3 = Abc_Lit2Var(pGVar7[-uVar8].Value);
      uVar4 = Abc_Lit2Var(pGVar7[-((ulong)*(uint *)&pGVar7->field_0x4 & 0x1fffffff)].Value);
      uVar5 = Abc_LitIsCompl(pGVar7[-(*(ulong *)pGVar7 & 0x1fffffff)].Value);
      uVar2 = (uint)(*(ulong *)pGVar7 >> 0x1d);
      uVar10 = uVar2 & 1;
      uVar6 = Abc_LitIsCompl(pGVar7[-(*(ulong *)pGVar7 >> 0x20 & 0x1fffffff)].Value);
      uVar9 = (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3d) & 1;
      if ((uVar5 == uVar10) || (uVar6 == uVar9)) {
        if (((uVar5 == uVar10) || (Var = uVar4, uVar6 != uVar9)) &&
           ((uVar5 != uVar10 || (Var = uVar3, uVar6 == uVar9)))) {
          if ((fGrow & 1U) == 0) goto LAB_00452f5b;
          goto LAB_00452f27;
        }
      }
      else if ((fGrow & 1U) == 0) {
LAB_00452f27:
        Var = uVar4;
        if (uVar4 < uVar3) {
          Var = uVar3;
        }
      }
      else {
LAB_00452f5b:
        Var = uVar4;
        if (uVar3 < uVar4) {
          Var = uVar3;
        }
      }
      uVar2 = Abc_Var2Lit(Var,(uVar9 ^ uVar6) & (uVar2 & 7 ^ uVar5));
      pGVar7->Value = uVar2;
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

void Bmc_CexCarePropagateFwdOne( Gia_Man_t * p, Abc_Cex_t * pCex, int f, int fGrow )
{
    Gia_Obj_t * pObj;
    int Prio, Prio0, Prio1;
    int i, Phase0, Phase1;
    if ( (fGrow & 2) )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Abc_Var2Lit( f * pCex->nPis + (pCex->nPis-1-i) + 1, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Abc_Var2Lit( f * pCex->nPis + i + 1, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        Prio0  = Abc_Lit2Var(Gia_ObjFanin0(pObj)->Value);
        Prio1  = Abc_Lit2Var(Gia_ObjFanin1(pObj)->Value);
        Phase0 = Abc_LitIsCompl(Gia_ObjFanin0(pObj)->Value) ^ Gia_ObjFaninC0(pObj);
        Phase1 = Abc_LitIsCompl(Gia_ObjFanin1(pObj)->Value) ^ Gia_ObjFaninC1(pObj);
        if ( Phase0 && Phase1 )
            Prio = (fGrow & 1) ? Abc_MinInt(Prio0, Prio1) : Abc_MaxInt(Prio0, Prio1);
        else if ( Phase0 && !Phase1 )
            Prio = Prio1;
        else if ( !Phase0 && Phase1 )
            Prio = Prio0;
        else // if ( !Phase0 && !Phase1 )
            Prio = (fGrow & 1) ? Abc_MaxInt(Prio0, Prio1) : Abc_MinInt(Prio0, Prio1);
        pObj->Value = Abc_Var2Lit( Prio, Phase0 & Phase1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Abc_LitNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
}